

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O0

void __thiscall
S2VertexIdLaxLoopShape::Init
          (S2VertexIdLaxLoopShape *this,vector<int,_std::allocator<int>_> *vertex_ids,
          S2Point *vertex_array)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  int *__p;
  const_iterator __first;
  const_iterator __last;
  pointer __result;
  S2Point *vertex_array_local;
  vector<int,_std::allocator<int>_> *vertex_ids_local;
  S2VertexIdLaxLoopShape *this_local;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(vertex_ids);
  *(int *)&(this->super_S2Shape).field_0xc = (int)sVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)&(this->super_S2Shape).field_0xc;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __p = (int *)operator_new__(uVar3);
  std::unique_ptr<int[],std::default_delete<int[]>>::reset<int*,void>
            ((unique_ptr<int[],std::default_delete<int[]>> *)&this->vertex_ids_,__p);
  __first = std::vector<int,_std::allocator<int>_>::begin(vertex_ids);
  __last = std::vector<int,_std::allocator<int>_>::end(vertex_ids);
  __result = std::unique_ptr<int[],_std::default_delete<int[]>_>::get(&this->vertex_ids_);
  std::copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __first._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __last._M_current,__result);
  this->vertex_array_ = vertex_array;
  return;
}

Assistant:

void S2VertexIdLaxLoopShape::Init(const std::vector<int32>& vertex_ids,
                           const S2Point* vertex_array) {
  num_vertices_ = vertex_ids.size();
  vertex_ids_.reset(new int32[num_vertices_]);
  std::copy(vertex_ids.begin(), vertex_ids.end(), vertex_ids_.get());
  vertex_array_ = vertex_array;
}